

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcbormap.cpp
# Opt level: O1

void __thiscall QCborMap::detach(QCborMap *this,qsizetype reserved)

{
  __atomic_base<int> _Var1;
  int iVar2;
  undefined4 extraout_var;
  void *in_RCX;
  int in_EDX;
  QCborContainerPrivate *ptr;
  
  ptr = (this->d).d.ptr;
  if (reserved == 0) {
    if (ptr == (QCborContainerPrivate *)0x0) {
      reserved = 0;
    }
    else {
      reserved = (ptr->elements).d.size & 0x7fffffffffffffe;
    }
  }
  if ((ptr == (QCborContainerPrivate *)0x0) ||
     (_Var1._M_i = *(__int_type_conflict *)
                    &(ptr->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value,
     in_RCX = (void *)(ulong)(uint)_Var1._M_i,
     (__atomic_base<int>)_Var1._M_i != (__atomic_base<int>)0x1)) {
    iVar2 = QCborContainerPrivate::clone((__fn *)ptr,(void *)reserved,in_EDX,in_RCX);
    ptr = (QCborContainerPrivate *)CONCAT44(extraout_var,iVar2);
  }
  QExplicitlySharedDataPointer<QCborContainerPrivate>::reset(&this->d,ptr);
  return;
}

Assistant:

void QCborMap::detach(qsizetype reserved)
{
    d = QCborContainerPrivate::detach(d.data(), reserved ? reserved : size() * 2);
}